

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

void getLogFname(char *logpath)

{
  size_t sVar1;
  char *local_18;
  char *folder;
  char *logpath_local;
  
  local_18 = getenv("TMPDIR");
  if (local_18 == (char *)0x0) {
    local_18 = "/tmp";
  }
  strncpy(logpath,local_18,0xff);
  sVar1 = strlen(logpath);
  strncat(logpath,"/open-license.log",0xff - sVar1);
  return;
}

Assistant:

static void getLogFname(char* logpath) {
#ifdef __unix__
	const char *folder = getenv("TMPDIR");
	if (folder == nullptr) {
		folder = "/tmp";
	}
	strncpy(logpath, folder, MAX_PATH);
	strncat(logpath, "/open-license.log", MAX_PATH - strlen(logpath));
#else
	const int plen = GetTempPath(MAX_PATH, logpath);
	if(plen == 0) {
		fprintf(stderr, "Error getting temporary directory path");
	}
	strncat(logpath, "open-license.log", MAX_PATH - strlen(logpath));
#endif
}